

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

wtree_object wtree_init(wave_object wave,int siglength,int J)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  wtree_object pwVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  if (J < 0x65) {
    iVar2 = wave->filtlength;
    iVar4 = wmaxiter(siglength);
    if (J <= iVar4) {
      iVar10 = 0;
      iVar5 = 0;
      if (0 < J) {
        iVar5 = J;
      }
      iVar7 = 1;
      iVar11 = 0;
      while (bVar12 = iVar5 != 0, iVar5 = iVar5 + -1, bVar12) {
        iVar11 = iVar11 + iVar7 * 2;
        iVar3 = iVar7 * 2;
        iVar7 = iVar7 * 2;
        iVar10 = iVar10 + (iVar3 + -1) * (iVar2 + -2);
      }
      iVar10 = iVar10 + (J + 1) * siglength;
      lVar9 = (long)(iVar11 + iVar10 + J);
      pwVar6 = (wtree_object)malloc(lVar9 * 8 + 0x208);
      pwVar6->outlength = iVar10;
      builtin_strncpy(pwVar6->ext,"sym",4);
      pwVar6->wave = wave;
      pwVar6->siglength = siglength;
      pwVar6->J = J;
      pwVar6->MaxIter = iVar4;
      builtin_strncpy(pwVar6->method,"dwt",4);
      pwVar6->even = ~siglength & 1;
      pwVar6->cobj = (conv_object)0x0;
      pwVar6->nodes = iVar11;
      pwVar6->cfftset = 0;
      pwVar6->lenlength = J + 2;
      pwVar6->output = (double *)(pwVar6 + 1);
      pwVar6->nodelength = (int *)(pwVar6[1].method + (long)iVar10 * 8 + -0x10);
      pwVar6->coeflength = (int *)(pwVar6[1].method + (long)(iVar11 + iVar10) * 8 + -0x10);
      for (lVar8 = 0; lVar8 <= lVar9; lVar8 = lVar8 + 1) {
        pcVar1 = pwVar6[1].method + lVar8 * 8 + -0x10;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      return pwVar6;
    }
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n");
  }
  else {
    puts("\n The Decomposition Iterations Cannot Exceed 100. Exiting ");
  }
  exit(-1);
}

Assistant:

wtree_object wtree_init(wave_object wave, int siglength,int J) {
    int size,i,MaxIter,temp,temp2,elength,nodes;
	wtree_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}


	MaxIter = wmaxiter(siglength);
	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n", MaxIter);
		exit(-1);
	}
	temp = 1;
	elength = 0;
	nodes = 0;
	for(i = 0; i < J;++i) {
	  temp *= 2;
	  nodes += temp;
	  temp2 = (size - 2) * (temp - 1);
	  elength += temp2;
	}

	obj = (wtree_object)malloc(sizeof(struct wtree_set) + sizeof(double)* (siglength * (J + 1) + elength + nodes + J + 1));
	obj->outlength = siglength * (J + 1) + elength;
	strcpy(obj->ext, "sym");

	obj->wave = wave;
	obj->siglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;
	strcpy(obj->method, "dwt");

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;
	obj->nodes = nodes;

	obj->cfftset = 0;
	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	obj->nodelength = (int*) &obj->params[siglength * (J + 1) + elength];
	obj->coeflength = (int*)&obj->params[siglength * (J + 1) + elength + nodes];

	for (i = 0; i < siglength * (J + 1) + elength + nodes + J + 1; ++i) {
	       obj->params[i] = 0.0;
	}

	//wave_summary(obj->wave);

	return obj;
}